

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_imp.h
# Opt level: O2

UBool icu_63::UTF8::isValidTrail(int32_t prev,uint8_t t,int32_t i,int32_t length)

{
  if (1 < i || length < 3) {
    return (char)t < -0x40;
  }
  if (length == 3) {
    return '\x01' << (t >> 5) & " 000000000000\x1000"[prev & 0xf];
  }
  return (byte)(1 << ((byte)prev & 7)) & ""[t >> 4];
}

Assistant:

static inline UBool isValidTrail(int32_t prev, uint8_t t, int32_t i, int32_t length) {
        // The first trail byte after a 3- or 4-byte lead byte
        // needs to be validated together with its lead byte.
        if (length <= 2 || i > 1) {
            return U8_IS_TRAIL(t);
        } else if (length == 3) {
            return U8_IS_VALID_LEAD3_AND_T1(prev, t);
        } else {  // length == 4
            return U8_IS_VALID_LEAD4_AND_T1(prev, t);
        }
    }